

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9BalanceLut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *pGVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  local_4c = 8;
  local_54 = 6;
  local_48 = 1;
  local_50 = 0;
  local_44 = local_48;
  local_40 = local_48;
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"KCnmravwh");
    iVar5 = globalUtilOptind;
    switch(iVar2) {
    case 0x6d:
      local_44 = local_44 ^ 1;
      break;
    case 0x6e:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x74:
    case 0x75:
      goto switchD_0024404c_caseD_6f;
    case 0x72:
      local_40 = local_40 ^ 1;
      break;
    case 0x76:
      local_50 = local_50 ^ 1;
    case 0x77:
      break;
    default:
      if (iVar2 == 0x43) {
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-C\" should be followed by a char string.\n";
          goto LAB_00244115;
        }
        uVar3 = atoi(argv[globalUtilOptind]);
        local_4c = uVar3;
      }
      else {
        if (iVar2 != 0x4b) {
          if (iVar2 != 0x61) {
            if (iVar2 == -1) {
              pGVar4 = pAbc->pGia;
              if (pGVar4 != (Gia_Man_t *)0x0) {
                if (bVar1) {
                  pGVar4 = Gia_ManBalanceLut(pGVar4,local_54,local_4c,local_50);
                }
                else {
                  pGVar4 = Gia_ManLutBalance(pGVar4,local_54,local_44,local_40,local_48,local_50);
                }
                Abc_FrameUpdateGia(pAbc,pGVar4);
                return 0;
              }
              pcVar6 = "Abc_CommandAbc9BalanceLut(): There is no AIG.\n";
              iVar5 = -1;
              goto LAB_002441f7;
            }
            goto switchD_0024404c_caseD_6f;
          }
          local_48 = local_48 ^ 1;
          break;
        }
        if (argc <= globalUtilOptind) {
          pcVar6 = "Command line switch \"-K\" should be followed by a char string.\n";
LAB_00244115:
          Abc_Print(-1,pcVar6);
          goto switchD_0024404c_caseD_6f;
        }
        uVar3 = atoi(argv[globalUtilOptind]);
        local_54 = uVar3;
      }
      globalUtilOptind = iVar5 + 1;
      if ((int)uVar3 < 0) {
switchD_0024404c_caseD_6f:
        iVar5 = -2;
        Abc_Print(-2,"usage: &blut [-KC num] [-mravh]\n");
        Abc_Print(-2,"\t           performs AIG balancing for the given LUT size\n");
        Abc_Print(-2,"\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n",6,
                  (ulong)local_54);
        Abc_Print(-2,"\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n",
                  8,(ulong)local_4c);
        pcVar7 = "yes";
        pcVar6 = "yes";
        if (local_44 == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-m       : toggle performing MUX restructuring [default = %s]\n",pcVar6);
        pcVar6 = "yes";
        if (local_40 == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-r       : toggle performing recursive restructuring [default = %s]\n",
                  pcVar6);
        pcVar6 = "yes";
        if (local_48 == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-a       : toggle performing area-oriented restructuring [default = %s]\n",
                  pcVar6);
        if (local_50 == 0) {
          pcVar7 = "no";
        }
        Abc_Print(-2,"\t-v       : toggle printing verbose information [default = %s]\n",pcVar7);
        pcVar6 = "\t-h       : print the command usage\n";
LAB_002441f7:
        Abc_Print(iVar5,pcVar6);
        return 1;
      }
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9BalanceLut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManBalanceLut( Gia_Man_t * p, int nLutSize, int nCutNum, int fVerbose );
    extern Gia_Man_t * Gia_ManLutBalance( Gia_Man_t * p, int nLutSize, int fUseMuxes, int fRecursive, int fOptArea, int fVerbose );
    Gia_Man_t * pTemp = NULL;
    int fUseOld      = 0;
    int nLutSize     = 6;
    int nCutNum      = 8;
    int fUseMuxes    = 1;
    int fRecursive   = 1;
    int fOptArea     = 1;
    int c, fVerbose  = 0;
    int fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCnmravwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a char string.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a char string.\n" );
                goto usage;
            }
            nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutNum < 0 )
                goto usage;
            break;
        case 'n':
            fUseOld ^= 1;
            break;
        case 'm':
            fUseMuxes ^= 1;
            break;
        case 'r':
            fRecursive ^= 1;
            break;
        case 'a':
            fOptArea ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9BalanceLut(): There is no AIG.\n" );
        return 1;
    }
    if ( fUseOld )
        pTemp = Gia_ManBalanceLut( pAbc->pGia, nLutSize, nCutNum, fVerbose );
    else
        pTemp = Gia_ManLutBalance( pAbc->pGia, nLutSize, fUseMuxes, fRecursive, fOptArea, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &blut [-KC num] [-mravh]\n" );
    Abc_Print( -2, "\t           performs AIG balancing for the given LUT size\n" );
    Abc_Print( -2, "\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n", 6, nLutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n", 8, nCutNum );
    Abc_Print( -2, "\t-m       : toggle performing MUX restructuring [default = %s]\n", fUseMuxes? "yes": "no" );
    Abc_Print( -2, "\t-r       : toggle performing recursive restructuring [default = %s]\n", fRecursive? "yes": "no" );
    Abc_Print( -2, "\t-a       : toggle performing area-oriented restructuring [default = %s]\n", fOptArea? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
//    Abc_Print( -2, "\t-w       : toggle printing additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}